

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O2

void Abc_FlowRetime_MarkBlocks(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  int iVar4;
  
  if (pManMR->fIsForward == 0) {
    for (iVar4 = 0; iVar4 < pNtk->vPis->nSize; iVar4 = iVar4 + 1) {
      pAVar3 = Abc_NtkPi(pNtk,iVar4);
      pAVar3->field_0x14 = pAVar3->field_0x14 | 0x10;
    }
    for (iVar4 = 0; iVar4 < pNtk->vBoxes->nSize; iVar4 = iVar4 + 1) {
      pAVar3 = Abc_NtkBox(pNtk,iVar4);
      if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 8) {
        *(uint *)&pAVar3->field_0x14 = *(uint *)&pAVar3->field_0x14 | 0x10;
      }
    }
    for (iVar4 = 0; iVar4 < pNtk->vPos->nSize; iVar4 = iVar4 + 1) {
      pAVar3 = Abc_NtkPo(pNtk,iVar4);
      Abc_NtkMarkCone_rec(pAVar3,pManMR->fIsForward);
    }
    if (pManMR->fBlockConst != 0) {
      for (iVar4 = 0; iVar4 < pNtk->vObjs->nSize; iVar4 = iVar4 + 1) {
        pAVar3 = Abc_NtkObj(pNtk,iVar4);
        if (pAVar3 != (Abc_Obj_t *)0x0) {
          if (pNtk->ntkType == ABC_NTK_STRASH) {
            iVar2 = Abc_AigNodeIsConst(pAVar3);
            if (iVar2 == 0) {
              if (pNtk->ntkType == ABC_NTK_STRASH) goto LAB_0040edc1;
              goto LAB_0040ed9d;
            }
          }
          else {
LAB_0040ed9d:
            iVar2 = Abc_NodeIsConst(pAVar3);
            if (iVar2 == 0) goto LAB_0040edc1;
          }
          *(ushort *)(pManMR->pDataArray + (uint)pAVar3->Id) =
               *(ushort *)(pManMR->pDataArray + (uint)pAVar3->Id) | 0x10;
        }
LAB_0040edc1:
      }
    }
  }
  else {
    for (iVar4 = 0; iVar4 < pNtk->vPos->nSize; iVar4 = iVar4 + 1) {
      pAVar3 = Abc_NtkPo(pNtk,iVar4);
      pAVar3->field_0x14 = pAVar3->field_0x14 | 0x10;
    }
    for (iVar4 = 0; iVar4 < pNtk->vBoxes->nSize; iVar4 = iVar4 + 1) {
      pAVar3 = Abc_NtkBox(pNtk,iVar4);
      if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 8) {
        *(uint *)&pAVar3->field_0x14 = *(uint *)&pAVar3->field_0x14 | 0x10;
      }
    }
    for (iVar4 = 0; iVar4 < pNtk->vPis->nSize; iVar4 = iVar4 + 1) {
      pAVar3 = Abc_NtkPi(pNtk,iVar4);
      Abc_NtkMarkCone_rec(pAVar3,pManMR->fIsForward);
    }
  }
  for (iVar4 = 0; iVar4 < pNtk->vObjs->nSize; iVar4 = iVar4 + 1) {
    pAVar3 = Abc_NtkObj(pNtk,iVar4);
    if (((pAVar3 != (Abc_Obj_t *)0x0) && (uVar1 = *(uint *)&pAVar3->field_0x14, (uVar1 & 0x10) != 0)
        ) && (*(uint *)&pAVar3->field_0x14 = uVar1 & 0xffffffef, (uVar1 & 0xf) != 8)) {
      *(ushort *)(pManMR->pDataArray + (uint)pAVar3->Id) =
           *(ushort *)(pManMR->pDataArray + (uint)pAVar3->Id) | 0x10;
    }
  }
  return;
}

Assistant:

void
Abc_FlowRetime_MarkBlocks( Abc_Ntk_t * pNtk ) {
  int i;
  Abc_Obj_t *pObj;

  if (pManMR->fIsForward){
    // --- forward retiming : block TFO of inputs    

    // mark the frontier
    Abc_NtkForEachPo( pNtk, pObj, i )
      pObj->fMarkA = 1;
    Abc_NtkForEachLatch( pNtk, pObj, i )
      {
        pObj->fMarkA = 1;
      }
    // mark the nodes reachable from the PIs
    Abc_NtkForEachPi( pNtk, pObj, i )
      Abc_NtkMarkCone_rec( pObj, pManMR->fIsForward );
  } else {
    // --- backward retiming : block TFI of outputs

    // mark the frontier
    Abc_NtkForEachPi( pNtk, pObj, i )
      pObj->fMarkA = 1;
    Abc_NtkForEachLatch( pNtk, pObj, i )
      {
        pObj->fMarkA = 1;
      }
    // mark the nodes reachable from the POs
    Abc_NtkForEachPo( pNtk, pObj, i )
      Abc_NtkMarkCone_rec( pObj, pManMR->fIsForward );
    // block constant nodes (if enabled)
    if (pManMR->fBlockConst) {
      Abc_NtkForEachObj( pNtk, pObj, i )
        if ((Abc_NtkIsStrash(pNtk) && Abc_AigNodeIsConst(pObj)) ||
            (!Abc_NtkIsStrash(pNtk) && Abc_NodeIsConst(pObj))) {
          FSET(pObj, BLOCK);
        }
    }
  }

  // copy marks
  Abc_NtkForEachObj( pNtk, pObj, i ) {
    if (pObj->fMarkA) {
      pObj->fMarkA = 0;
      if (!Abc_ObjIsLatch(pObj) /* && !Abc_ObjIsPi(pObj) */ )
        FSET(pObj, BLOCK);
    }
  }
}